

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O2

CDefineTable * __thiscall CDefineTable::operator=(CDefineTable *this,CDefineTable *defTable)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  
  RemoveAll(this);
  for (lVar3 = 8; lVar3 != 0x408; lVar3 = lVar3 + 8) {
    plVar2 = (long *)((long)defTable->defs + lVar3 + -8);
    while (puVar1 = (undefined8 *)*plVar2, puVar1 != (undefined8 *)0x0) {
      Add(this,(char *)*puVar1,(char *)puVar1[1],(CStringsList *)puVar1[2]);
      plVar2 = puVar1 + 3;
    }
  }
  return this;
}

Assistant:

CDefineTable& CDefineTable::operator=(CDefineTable const & defTable) {
	RemoveAll();
	for (CDefineTableEntry* srcDef : defTable.defs) {
		CDefineTableEntry* srcD = srcDef;
		while (srcD) {
			Add(srcD->name, srcD->value, srcD->nss);
			srcD = srcD->next;
		}
	}
	return *this;
}